

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BotSharedData.cpp
# Opt level: O0

void __thiscall tiger::trains::ai::BotSharedData::clear(BotSharedData *this,World *world)

{
  bool bVar1;
  int iVar2;
  reference ppTVar3;
  size_type sVar4;
  const_reference ppIVar5;
  IPost *pIVar6;
  undefined4 extraout_var;
  World *in_RSI;
  Train *in_RDI;
  HomeChecker *unaff_retaddr;
  Train *train;
  const_iterator __end1;
  const_iterator __begin1;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *__range1;
  Train *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  Train *this_00;
  __normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
  local_20;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *local_18;
  World *local_10;
  Train *inPoints;
  
  local_10 = in_RSI;
  inPoints = in_RDI;
  local_18 = trains::world::World::getTrainList(in_RSI);
  local_20._M_current =
       (Train **)
       std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
       begin((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
              *)in_stack_ffffffffffffffb8);
  std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::end
            ((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
              *)in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (__normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    ppTVar3 = __gnu_cxx::
              __normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
              ::operator*(&local_20);
    this_00 = *ppTVar3;
    sVar4 = std::
            map<const_tiger::trains::world::Train_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>_>
            ::count((map<const_tiger::trains::world::Train_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>_>
                     *)this_00,(key_type *)in_RDI);
    if (sVar4 != 0) {
      trains::world::Train::getEvents(this_00);
      bVar1 = std::
              vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
              ::empty((vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
                       *)this_00);
      if (!bVar1) {
        trains::world::Train::getEvents(this_00);
        ppIVar5 = std::
                  vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
                  ::back((vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
                          *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        in_stack_ffffffffffffffc4 = (*(*ppIVar5)->_vptr_IEvent[3])();
        iVar2 = trains::world::World::getTickNum(local_10);
        if (iVar2 + -3 <= in_stack_ffffffffffffffc4) {
          std::
          map<const_tiger::trains::world::Train_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>_>
          ::operator[]((map<const_tiger::trains::world::Train_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>_>
                        *)unaff_retaddr,(key_type *)inPoints);
          std::
          set<const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<const_tiger::trains::world::Point_*>_>
          ::erase((set<const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<const_tiger::trains::world::Point_*>_>
                   *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  (key_type *)in_stack_ffffffffffffffb8);
          std::
          map<const_tiger::trains::world::Train_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>_>
          ::erase((map<const_tiger::trains::world::Train_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>_>
                   *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  (key_type *)in_stack_ffffffffffffffb8);
        }
      }
    }
    in_stack_ffffffffffffffb8 = (Train *)trains::world::Train::getPoint(in_RDI);
    trains::world::Train::getPlayer(this_00);
    pIVar6 = trains::world::Player::getHome((Player *)0x2562d4);
    iVar2 = (*pIVar6->_vptr_IPost[5])();
    if (in_stack_ffffffffffffffb8 == (Train *)CONCAT44(extraout_var,iVar2)) {
      HomeChecker::comeHome
                ((HomeChecker *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
    }
    __gnu_cxx::
    __normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
    ::operator++(&local_20);
  }
  HomeChecker::blockHome
            (unaff_retaddr,
             (set<const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<const_tiger::trains::world::Point_*>_>
              *)inPoints);
  return;
}

Assistant:

void BotSharedData::clear(world::World *world)
{
    for (auto train : world->getTrainList())
    {
        if (trainInPoints.count(train) != 0 && !train->getEvents().empty() &&
                train->getEvents().back()->getTick() >= world->getTickNum() - 3)
        {

            inPoints.erase(trainInPoints[train]);
            trainInPoints.erase(train);
        }

        if (train->getPoint() == train->getPlayer()->getHome()->getPoint())
            cheker.comeHome(train);

    }

    cheker.blockHome(inPoints);
}